

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SPandVC.cpp
# Opt level: O3

void * Thread1_IO(void *arg)

{
  sockaddr *__addr;
  byte bVar1;
  char cVar2;
  int iVar3;
  undefined8 *puVar4;
  char *pcVar5;
  bool bVar6;
  char c;
  char character;
  int vEnd;
  int vStart;
  uint ver2;
  uint ver1;
  uint vertexMaxNum;
  string line;
  string edgesString;
  istringstream input;
  istringstream EInput;
  char local_41a;
  char local_419 [9];
  uint local_410;
  uint local_40c;
  int local_408;
  uint local_404;
  uint local_400;
  uint local_3fc;
  vector<std::vector<V_*,_std::allocator<V_*>_>,_std::allocator<std::vector<V_*,_std::allocator<V_*>_>_>_>
  local_3f8;
  undefined8 local_3e0;
  undefined1 *local_3d8;
  undefined8 local_3d0;
  undefined1 local_3c8 [16];
  undefined1 *local_3b8;
  undefined8 local_3b0;
  undefined1 local_3a8 [16];
  undefined1 local_398 [104];
  pointer local_330 [4];
  byte abStack_310 [88];
  ios_base local_2b8 [264];
  istringstream local_1b0 [120];
  ios_base local_138 [264];
  
  local_3b8 = local_3a8;
  local_3b0 = 0;
  local_3a8[0] = 0;
  local_40c = 0;
  local_410 = 0;
  local_3e0 = 0;
  if ((*(int *)((long)arg + 0x9c) != 0) && (*(int *)((long)arg + 0x98) != 0)) {
    countVec = 0;
    Graph::printVC((Graph *)arg);
  }
  local_408 = 0;
  do {
    local_3d8 = local_3c8;
    local_3d0 = 0;
    local_3c8[0] = 0;
    cVar2 = std::ios::widen((char)*(undefined8 *)(std::cin + -0x18) + '0');
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&std::cin,(string *)&local_3d8,cVar2);
    std::__cxx11::istringstream::istringstream
              ((istringstream *)local_330,(string *)&local_3d8,_S_in);
    local_3f8.
    super__Vector_base<std::vector<V_*,_std::allocator<V_*>_>,_std::allocator<std::vector<V_*,_std::allocator<V_*>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_3f8.
    super__Vector_base<std::vector<V_*,_std::allocator<V_*>_>,_std::allocator<std::vector<V_*,_std::allocator<V_*>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_3f8.
    super__Vector_base<std::vector<V_*,_std::allocator<V_*>_>,_std::allocator<std::vector<V_*,_std::allocator<V_*>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (((byte)__cxa_pure_virtual[*(long *)(std::cin + -0x18)] & 2) != 0) {
      exit(0);
    }
    bVar1 = abStack_310
            [(long)local_330[0][-1].super__Vector_base<V_*,_std::allocator<V_*>_>._M_impl.
                   super__Vector_impl_data._M_start];
    while (((bVar1 & 2) == 0 &&
           (std::operator>>((istream *)local_330,local_419),
           (abStack_310
            [(long)local_330[0][-1].super__Vector_base<V_*,_std::allocator<V_*>_>._M_impl.
                   super__Vector_impl_data._M_start] & 5) == 0))) {
      if (local_419[0] == 'E') {
        std::operator>>((istream *)local_330,(string *)&local_3b8);
        std::__cxx11::istringstream::istringstream(local_1b0,(string *)&local_3b8,_S_in);
        std::operator>>((istream *)local_1b0,&local_41a);
        while (local_41a != '}') {
          std::operator>>((istream *)local_1b0,&local_41a);
          if (local_41a == '}') goto LAB_00109e86;
          std::istream::_M_extract<unsigned_int>((uint *)local_1b0);
          std::operator>>((istream *)local_1b0,&local_41a);
          std::istream::_M_extract<unsigned_int>((uint *)local_1b0);
          std::operator>>((istream *)local_1b0,&local_41a);
          std::operator>>((istream *)local_1b0,&local_41a);
          if ((*(uint *)((long)arg + 0x48) <= local_404) ||
             (*(uint *)((long)arg + 0x48) <= local_400)) {
            puVar4 = (undefined8 *)__cxa_allocate_exception(8);
            *puVar4 = "Point order out of range.";
            __cxa_throw(puVar4,&char_const*::typeinfo,0);
          }
          __addr = (sockaddr *)(local_398 + 0x50);
          std::
          vector<std::vector<V_*,_std::allocator<V_*>_>,_std::allocator<std::vector<V_*,_std::allocator<V_*>_>_>_>
          ::vector((vector<std::vector<V_*,_std::allocator<V_*>_>,_std::allocator<std::vector<V_*,_std::allocator<V_*>_>_>_>
                    *)__addr,&local_3f8);
          Graph::connect((Graph *)local_398,(int)arg,__addr,local_400);
          local_398._48_8_ =
               local_3f8.
               super__Vector_base<std::vector<V_*,_std::allocator<V_*>_>,_std::allocator<std::vector<V_*,_std::allocator<V_*>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          local_398._40_8_ =
               local_3f8.
               super__Vector_base<std::vector<V_*,_std::allocator<V_*>_>,_std::allocator<std::vector<V_*,_std::allocator<V_*>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          local_398._32_8_ =
               local_3f8.
               super__Vector_base<std::vector<V_*,_std::allocator<V_*>_>,_std::allocator<std::vector<V_*,_std::allocator<V_*>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
          local_3f8.
          super__Vector_base<std::vector<V_*,_std::allocator<V_*>_>,_std::allocator<std::vector<V_*,_std::allocator<V_*>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_398._16_8_;
          local_3f8.
          super__Vector_base<std::vector<V_*,_std::allocator<V_*>_>,_std::allocator<std::vector<V_*,_std::allocator<V_*>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)local_398._0_8_;
          local_3f8.
          super__Vector_base<std::vector<V_*,_std::allocator<V_*>_>,_std::allocator<std::vector<V_*,_std::allocator<V_*>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_398._8_8_;
          local_398._0_8_ = (pointer)0x0;
          local_398._8_8_ = (pointer)0x0;
          local_398._16_8_ = (pointer)0x0;
          std::
          vector<std::vector<V_*,_std::allocator<V_*>_>,_std::allocator<std::vector<V_*,_std::allocator<V_*>_>_>_>
          ::~vector((vector<std::vector<V_*,_std::allocator<V_*>_>,_std::allocator<std::vector<V_*,_std::allocator<V_*>_>_>_>
                     *)(local_398 + 0x20));
          std::
          vector<std::vector<V_*,_std::allocator<V_*>_>,_std::allocator<std::vector<V_*,_std::allocator<V_*>_>_>_>
          ::~vector((vector<std::vector<V_*,_std::allocator<V_*>_>,_std::allocator<std::vector<V_*,_std::allocator<V_*>_>_>_>
                     *)local_398);
          std::
          vector<std::vector<V_*,_std::allocator<V_*>_>,_std::allocator<std::vector<V_*,_std::allocator<V_*>_>_>_>
          ::~vector((vector<std::vector<V_*,_std::allocator<V_*>_>,_std::allocator<std::vector<V_*,_std::allocator<V_*>_>_>_>
                     *)__addr);
        }
        std::
        vector<std::vector<V_*,_std::allocator<V_*>_>,_std::allocator<std::vector<V_*,_std::allocator<V_*>_>_>_>
        ::vector((vector<std::vector<V_*,_std::allocator<V_*>_>,_std::allocator<std::vector<V_*,_std::allocator<V_*>_>_>_>
                  *)(local_398 + 0x38),&local_3f8);
        Graph::setEdges((Graph *)arg,
                        (vector<std::vector<V_*,_std::allocator<V_*>_>,_std::allocator<std::vector<V_*,_std::allocator<V_*>_>_>_>
                         *)(local_398 + 0x38));
        std::
        vector<std::vector<V_*,_std::allocator<V_*>_>,_std::allocator<std::vector<V_*,_std::allocator<V_*>_>_>_>
        ::~vector((vector<std::vector<V_*,_std::allocator<V_*>_>,_std::allocator<std::vector<V_*,_std::allocator<V_*>_>_>_>
                   *)(local_398 + 0x38));
        local_3e0 = 1;
LAB_00109e86:
        *(undefined4 *)((long)arg + 0x9c) = 1;
        std::__cxx11::istringstream::~istringstream(local_1b0);
        std::ios_base::~ios_base(local_138);
      }
      else if (local_419[0] == 's') {
        std::istream::operator>>((istream *)local_330,(int *)&local_40c);
        std::istream::operator>>((istream *)local_330,(int *)&local_410);
        pcVar5 = "Point order out of range.";
        if ((*(uint *)((long)arg + 0x48) <= local_410) ||
           (pcVar5 = "Point order out of range.", *(uint *)((long)arg + 0x48) <= local_40c)) {
LAB_00109ef6:
          puVar4 = (undefined8 *)__cxa_allocate_exception(8);
          *puVar4 = pcVar5;
          __cxa_throw(puVar4,&char_const*::typeinfo,0);
        }
        Graph::BFS((Graph *)arg,local_40c);
        Graph::printResult((Graph *)arg,local_40c,local_410);
      }
      else if (local_419[0] == 'V') {
        std::istream::_M_extract<unsigned_int>((uint *)local_330);
        pcVar5 = "vertexMaxNum should be an unsigned integar.";
        if ((abStack_310
             [(long)local_330[0][-1].super__Vector_base<V_*,_std::allocator<V_*>_>._M_impl.
                    super__Vector_impl_data._M_start] & 5) != 0) goto LAB_00109ef6;
        Graph::setVertices((Graph *)arg,local_3fc);
        *(undefined4 *)((long)arg + 0x98) = 1;
        local_408 = 1;
      }
      bVar1 = abStack_310
              [(long)local_330[0][-1].super__Vector_base<V_*,_std::allocator<V_*>_>._M_impl.
                     super__Vector_impl_data._M_start];
    }
    bVar6 = local_408 != 0;
    iVar3 = (int)local_3e0;
    std::
    vector<std::vector<V_*,_std::allocator<V_*>_>,_std::allocator<std::vector<V_*,_std::allocator<V_*>_>_>_>
    ::~vector(&local_3f8);
    std::__cxx11::istringstream::~istringstream((istringstream *)local_330);
    std::ios_base::~ios_base(local_2b8);
    if (local_3d8 != local_3c8) {
      operator_delete(local_3d8);
    }
    if (bVar6 && iVar3 != 0) {
      if (local_3b8 != local_3a8) {
        operator_delete(local_3b8);
      }
      return (void *)0x0;
    }
  } while( true );
}

Assistant:

void *Thread1_IO(void *arg)
{
    struct thread_val* p = (struct thread_val*) arg;

    // Variables definition
    char cmd = '0';
    unsigned vertexMaxNum;
    std::string edgesString;
    int VcmdFlag = 0;
    int EcmdFlag = 0;
    int VEflag = 0;
    int vStart = 0;
    int vEnd = 0;

    // output
    if(!p->Database.isEmpty())
    {
        while(true)
        {
            if(countVec == 3)
            {
                countVec = 0;
                break;
            }
        }
        p->Database.printVC();
    }
    // input
    while(VEflag == 0)
    {
        // read a line of input until EOL and store in a string
        std::string line;
        std::getline(std::cin, line);
        std::istringstream input(line);

        Edgetype Edges;
        if(std::cin.eof())
        {
            exit(0);
        }
        // while there are characters in the input line
        while (!input.eof()) 
        {
            // read the first character
            char character;
            input >> character;
            if (input.fail())
            {
                break;
            }
            else
            {
                cmd = character;
            }
            try
            {
                switch(cmd)
                {
                    case 'V':
                        input >> vertexMaxNum;
                        if(input.fail())
                        {
                            throw "vertexMaxNum should be an unsigned integar.";
                            break;
                        }
                        p->Database.setVertices(vertexMaxNum);
                        VcmdFlag = 1;
                        p->Database.VEmpFlag = 1;
                        break;
                    case 'E':
                        {
                            input >> edgesString;

                            std::istringstream EInput(edgesString);
                            char c;
                            unsigned ver1,ver2;
                            int breakFlag = 0;

                            EInput >> c;// read '{'

                            while(c != '}')
                            {
                                EInput >> c;// read '<'
                                if(c!='}')
                                {
                                    EInput >> ver1;// read the first vertex
                                    EInput >> c;// read ','
                                    EInput >> ver2;// read the second vertex
                                    EInput >> c;// read '>'
                                    EInput >> c;// read ',' or '}'

                                    //to determine whether the point order is out of range
                                    if(p->Database.isOutOfRange(ver1,ver2))
                                    {
                                        throw "Point order out of range.";
                                        break;
                                    }

                                    Edges = p->Database.connect(Edges,ver1,ver2);
                                }
                                else
                                {
                                    breakFlag = 1;
                                    break;
                                }
                            }
                            if(breakFlag == 1)
                            {
                                p->Database.EEmpFlag = 1;
                                break;
                            }
                            p->Database.setEdges(Edges);
                            EcmdFlag = 1;
                            p->Database.EEmpFlag = 1;
                            break;
                        }
                        case 's':
                        {
                            input >> vStart ;
                            input >> vEnd;
                            //to determine whether the point order is out of range
                            if(p->Database.isOutOfRange(vStart,vEnd))
                            {
                                throw "Point order out of range.";
                                break;
                            }
                            p->Database.BFS(vStart);
                            p->Database.printResult(vStart,vEnd);
                            break;
                        }    
                    default:
                        break;
                }
            }
            catch(const char* msg)
            {
                std::cerr<< "Error: " << msg << std::endl;
            }
            catch(...)
            {
                std::cerr<< "Error: error happens in other cases."<<std::endl;
            }
        }

        // if read V and E
        if(VcmdFlag && EcmdFlag)
        {
            VEflag = 1;
        }
    }
    return NULL;
}